

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSorterWrite(sqlite3 *db,VdbeCursor *pCsr,Mem *pVal)

{
  VdbeSorter *pVVar1;
  int iVar2;
  SorterRecord *pSVar3;
  SorterRecord *pNew;
  int rc;
  VdbeSorter *pSorter;
  Mem *pVal_local;
  VdbeCursor *pCsr_local;
  sqlite3 *db_local;
  
  pVVar1 = pCsr->pSorter;
  pNew._4_4_ = 0;
  iVar2 = sqlite3VarintLen((long)pVal->n);
  pVVar1->nInMemory = iVar2 + pVal->n + pVVar1->nInMemory;
  pSVar3 = (SorterRecord *)sqlite3DbMallocRaw(db,pVal->n + 0x18);
  if (pSVar3 == (SorterRecord *)0x0) {
    pNew._4_4_ = 7;
  }
  else {
    pSVar3->pVal = pSVar3 + 1;
    memcpy(pSVar3->pVal,pVal->z,(long)pVal->n);
    pSVar3->nVal = pVal->n;
    pSVar3->pNext = pVVar1->pRecord;
    pVVar1->pRecord = pSVar3;
  }
  if (pNew._4_4_ != 0) {
    return pNew._4_4_;
  }
  if (pVVar1->mxPmaSize < 1) {
    return 0;
  }
  if (pVVar1->nInMemory <= pVVar1->mxPmaSize) {
    if (pVVar1->nInMemory <= pVVar1->mnPmaSize) {
      return 0;
    }
    iVar2 = sqlite3HeapNearlyFull();
    if (iVar2 == 0) {
      return 0;
    }
  }
  iVar2 = vdbeSorterListToPMA(db,pCsr);
  pVVar1->nInMemory = 0;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterWrite(
  sqlite3 *db,                    /* Database handle */
  const VdbeCursor *pCsr,               /* Sorter cursor */
  Mem *pVal                       /* Memory cell containing record */
){
  VdbeSorter *pSorter = pCsr->pSorter;
  int rc = SQLITE_OK;             /* Return Code */
  SorterRecord *pNew;             /* New list element */

  assert( pSorter );
  pSorter->nInMemory += sqlite3VarintLen(pVal->n) + pVal->n;

  pNew = (SorterRecord *)sqlite3DbMallocRaw(db, pVal->n + sizeof(SorterRecord));
  if( pNew==0 ){
    rc = SQLITE_NOMEM;
  }else{
    pNew->pVal = (void *)&pNew[1];
    memcpy(pNew->pVal, pVal->z, pVal->n);
    pNew->nVal = pVal->n;
    pNew->pNext = pSorter->pRecord;
    pSorter->pRecord = pNew;
  }

  /* See if the contents of the sorter should now be written out. They
  ** are written out when either of the following are true:
  **
  **   * The total memory allocated for the in-memory list is greater 
  **     than (page-size * cache-size), or
  **
  **   * The total memory allocated for the in-memory list is greater 
  **     than (page-size * 10) and sqlite3HeapNearlyFull() returns true.
  */
  if( rc==SQLITE_OK && pSorter->mxPmaSize>0 && (
        (pSorter->nInMemory>pSorter->mxPmaSize)
     || (pSorter->nInMemory>pSorter->mnPmaSize && sqlite3HeapNearlyFull())
  )){
#ifdef SQLITE_DEBUG
    i64 nExpect = pSorter->iWriteOff
                + sqlite3VarintLen(pSorter->nInMemory)
                + pSorter->nInMemory;
#endif
    rc = vdbeSorterListToPMA(db, pCsr);
    pSorter->nInMemory = 0;
    assert( rc!=SQLITE_OK || (nExpect==pSorter->iWriteOff) );
  }

  return rc;
}